

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"***-----------firstProgram.cpp----------***");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"***-----------secondProgram.cpp----------***");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"***-----------thirdProgram.cpp----------***");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"***-----------fouthProgram.cpp----------***");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main() {
    cout<<"***-----------firstProgram.cpp----------***"<<endl<<endl;
    //firstFunction();
    //extern const int externCount;
    //cout<<"经过EXTERN CONST限定符修饰，在其他文件内定义同名CONST变量："<<externCount<<endl;
   // secondFunction();
    //thirdFunction();
    //fouthFunction(6.786);
    cout<<"***-----------secondProgram.cpp----------***"<<endl<<endl;
    //calculateThePrice();
    //getlineTest();
    //vectorTest();
   // ddqTest();
    cout<<"***-----------thirdProgram.cpp----------***"<<endl<<endl;
    //cout<<"sch love you!"<<endl;
    //move_bit();
    cout<<"***-----------fouthProgram.cpp----------***"<<endl<<endl;

    return 0;
}